

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiBool aiIsExtensionSupported(char *szExtension)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  Importer local_28;
  Importer tmp;
  aiBool candoit;
  char *szExtension_local;
  
  if (szExtension != (char *)0x0) {
    tmp.pimpl._4_4_ = 0;
    Assimp::Importer::Importer(&local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,szExtension,&local_59);
    bVar1 = Assimp::Importer::IsExtensionSupported(&local_28,&local_58);
    tmp.pimpl._4_4_ = (uint)bVar1;
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    Assimp::Importer::~Importer(&local_28);
    return tmp.pimpl._4_4_;
  }
  __assert_fail("__null != szExtension",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                ,0x1dc,"aiBool aiIsExtensionSupported(const char *)");
}

Assistant:

aiBool aiIsExtensionSupported(const char* szExtension)
{
    ai_assert(NULL != szExtension);
    aiBool candoit=AI_FALSE;
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // FIXME: no need to create a temporary Importer instance just for that ..
    Assimp::Importer tmp;
    candoit = tmp.IsExtensionSupported(std::string(szExtension)) ? AI_TRUE : AI_FALSE;

    ASSIMP_END_EXCEPTION_REGION(aiBool);
    return candoit;
}